

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<std::pair<unsigned_int,_wasm::Name>_> * __thiscall
wasm::IRBuilder::getExtraOutputLocalAndLabel
          (Result<std::pair<unsigned_int,_wasm::Name>_> *__return_storage_ptr__,IRBuilder *this,
          Index label,size_t extraArity)

{
  long lVar1;
  __index_type *p_Var2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  Type TVar6;
  pointer pNVar7;
  undefined1 *puVar8;
  Iterator __first;
  Name NVar9;
  Iterator __last;
  undefined1 local_e8 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> scope;
  Type labelType;
  Type local_98;
  Type extraType;
  undefined1 local_88 [8];
  Result<wasm::Name> name;
  Result<wasm::IRBuilder::ScopeCtx_*> _val;
  
  getScope((Result<wasm::IRBuilder::ScopeCtx_*> *)local_e8,this,label);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)
                  ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                          super__Move_assign_alias<wasm::Name,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                  (_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_e8);
  if (_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)local_88,
               (string *)
               ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,std::pair<unsigned_int,wasm::Name>,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,std::pair<unsigned_int,wasm::Name>,wasm::Err> *)
               __return_storage_ptr__,local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)
                      ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)
                      ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    extraType.id = (long)local_e8 + 0x70;
    pNVar7 = (((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)local_e8 + 0x70))->
             super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)((long)local_e8 + 0x78) - (long)pNVar7 >> 4) < extraArity) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_e8 + 0x58),
                 extraArity);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::resize
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)extraType.id,extraArity);
      pNVar7 = (((vector<wasm::Name,_std::allocator<wasm::Name>_> *)extraType.id)->
               super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    lVar1 = extraArity - 1;
    if (pNVar7[lVar1].super_IString.str._M_str == (char *)0x0) {
      scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ =
           ScopeCtx::getLabelType((ScopeCtx *)local_e8);
      p_Var2 = (__index_type *)
               ((long)&scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)p_Var2;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = extraArity;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)p_Var2;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)
                 ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),__first,__last,
                 (allocator_type *)local_88);
      wasm::Type::Type(&local_98,
                       (Tuple *)((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                 ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      addScratchLocal((Result<unsigned_int> *)
                      ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),this,local_98);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_88,
                 (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
                 ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)&labelType,(string *)local_88);
        std::__detail::__variant::
        _Variant_storage<false,std::pair<unsigned_int,wasm::Name>,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,std::pair<unsigned_int,wasm::Name>,wasm::Err> *)
                   __return_storage_ptr__,&labelType);
        std::__cxx11::string::~string((string *)&labelType);
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_88);
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                          ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        goto LAB_00cdb2e9;
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_88);
      getLabelName((Result<wasm::Name> *)local_88,this,label,false);
      (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_e8 + 0x58))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[extraArity - 1] =
           name.val.super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_4_;
      puVar8 = local_88;
      if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ != '\0') {
        puVar8 = (undefined1 *)0x0;
      }
      NVar9.super_IString.str._M_str = *(char **)(puVar8 + 8);
      NVar9.super_IString.str._M_len = (size_t)local_88;
      NVar9 = makeFresh(this,NVar9,0);
      TVar6 = extraType;
      lVar3 = *(long *)extraType.id;
      *(size_t *)(lVar3 + lVar1 * 0x10) = NVar9.super_IString.str._M_len;
      *(char **)(lVar3 + 8 + lVar1 * 0x10) = NVar9.super_IString.str._M_str;
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_88);
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                 ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      pNVar7 = *(pointer *)TVar6.id;
    }
    uVar4 = pNVar7[lVar1].super_IString.str._M_len;
    pcVar5 = pNVar7[lVar1].super_IString.str._M_str;
    name.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_4_ = SUB84(uVar4,0);
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._0_4_ =
         (undefined4)((ulong)uVar4 >> 0x20);
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._4_4_ =
         SUB84(pcVar5,0);
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._8_4_ =
         (undefined4)((ulong)pcVar5 >> 0x20);
    *(uint *)&(__return_storage_ptr__->val).
              super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> =
         (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_e8 + 0x58))->
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start[extraArity - 1];
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
              4) = CONCAT44(name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                            super__Move_assign_alias<wasm::Name,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_4_,
                            name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                            super__Move_assign_alias<wasm::Name,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_4_);
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
              0xc) =
         CONCAT44(_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._4_4_,
                  _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._0_4_);
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x14) =
         _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._8_4_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x20) =
         '\0';
  }
LAB_00cdb2e9:
  std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Result<std::pair<Index, Name>>
IRBuilder::getExtraOutputLocalAndLabel(Index label, size_t extraArity) {
  auto scope = getScope(label);
  CHECK_ERR(scope);
  auto& s = **scope;
  auto i = extraArity - 1;
  if (s.outputLabels.size() < extraArity) {
    s.outputLocals.resize(extraArity);
    s.outputLabels.resize(extraArity);
  }
  if (!s.outputLabels[i]) {
    auto labelType = s.getLabelType();
    auto it = labelType.begin();
    Type extraType = Tuple(it, it + extraArity);
    auto local = addScratchLocal(extraType);
    CHECK_ERR(local);
    auto name = getLabelName(label);
    s.outputLocals[i] = *local;
    s.outputLabels[i] = makeFresh(*name);
  }

  return std::make_pair(s.outputLocals[i], s.outputLabels[i]);
}